

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pooling_x86.cpp
# Opt level: O3

int __thiscall
ncnn::Pooling_x86::forward(Pooling_x86 *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  size_t _elemsize;
  int *piVar1;
  Mat *pMVar2;
  int iVar3;
  ulong uVar4;
  uint uVar5;
  float *pfVar6;
  undefined1 (*pauVar7) [16];
  long lVar8;
  Option *opt_00;
  long lVar9;
  ulong uVar10;
  int iVar11;
  uint uVar12;
  uint uVar13;
  int iVar14;
  long lVar15;
  int iVar16;
  void *pvVar17;
  int iVar18;
  long lVar19;
  int k;
  ulong uVar20;
  int iVar21;
  ulong uVar22;
  uint uVar23;
  long lVar24;
  bool bVar25;
  float fVar26;
  __m128 _inv_maxk;
  undefined1 auVar27 [16];
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  vector<int,_std::allocator<int>_> _space_ofs;
  int local_114;
  int local_110;
  allocator_type local_109;
  Mat *local_108;
  ulong local_100;
  ulong local_f8;
  ulong local_f0;
  ulong local_e8;
  ulong local_e0;
  void *local_d8;
  long local_d0;
  Mat local_c8;
  long local_80;
  long local_78;
  long local_70;
  void *local_68;
  long local_60;
  void *local_58;
  ulong local_50;
  vector<int,_std::allocator<int>_> local_48;
  
  if (((this->super_Pooling).adaptive_pooling != 0) || (bottom_blob->elempack != 4)) {
    iVar3 = Pooling::forward(&this->super_Pooling,bottom_blob,top_blob,opt);
    return iVar3;
  }
  uVar23 = bottom_blob->c;
  uVar10 = (ulong)uVar23;
  _elemsize = bottom_blob->elemsize;
  if ((this->super_Pooling).global_pooling == 0) {
    local_c8.cstep = 0;
    local_c8.data = (void *)0x0;
    local_c8.refcount._0_4_ = 0;
    local_c8.refcount._4_4_ = 0;
    local_c8.elemsize._0_4_ = 0;
    local_c8.elemsize._4_4_ = 0;
    local_c8.elempack = 0;
    local_c8.allocator = (Allocator *)0x0;
    local_c8.dims = 0;
    local_c8.w = 0;
    local_c8.h = 0;
    local_c8.d = 0;
    local_c8.c = 0;
    local_108 = top_blob;
    local_100 = uVar10;
    Pooling::make_padding(&this->super_Pooling,bottom_blob,&local_c8,opt);
    iVar3 = local_c8.w;
    pMVar2 = local_108;
    iVar11 = -100;
    if ((local_c8.data != (void *)0x0) && ((long)local_c8.c * local_c8.cstep != 0)) {
      uVar10 = (long)(local_c8.w - (this->super_Pooling).kernel_w) /
               (long)(this->super_Pooling).stride_w;
      local_e0 = uVar10 & 0xffffffff;
      local_d0 = CONCAT44(local_d0._4_4_,local_c8.h);
      uVar4 = (long)(local_c8.h - (this->super_Pooling).kernel_h) /
              (long)(this->super_Pooling).stride_h;
      local_f8 = uVar4 & 0xffffffff;
      uVar23 = (int)uVar10 + 1;
      Mat::create(local_108,uVar23,(int)uVar4 + 1,(int)local_100,_elemsize,4,opt->blob_allocator);
      iVar11 = -100;
      if ((pMVar2->data != (void *)0x0) && ((long)pMVar2->c * pMVar2->cstep != 0)) {
        uVar10 = (long)(this->super_Pooling).kernel_h * (long)(this->super_Pooling).kernel_w;
        std::vector<int,_std::allocator<int>_>::vector(&local_48,uVar10,&local_109);
        uVar5 = (this->super_Pooling).kernel_w;
        uVar12 = (this->super_Pooling).kernel_h;
        opt_00 = (Option *)(ulong)uVar12;
        if (0 < (int)uVar12) {
          iVar11 = iVar3 - uVar5;
          iVar21 = 0;
          iVar14 = 0;
          iVar16 = 0;
          do {
            if (0 < (int)uVar5) {
              lVar9 = 0;
              do {
                local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start[iVar14 + lVar9] = iVar16 + (int)lVar9;
                uVar5 = (this->super_Pooling).kernel_w;
                lVar9 = lVar9 + 1;
                iVar18 = (int)lVar9;
              } while (iVar18 < (int)uVar5);
              iVar14 = iVar14 + iVar18;
              opt_00 = (Option *)(ulong)(uint)(this->super_Pooling).kernel_h;
              iVar16 = iVar16 + iVar18;
            }
            iVar16 = iVar16 + iVar11;
            iVar21 = iVar21 + 1;
          } while (iVar21 < (int)opt_00);
        }
        iVar11 = (this->super_Pooling).pooling_type;
        iVar21 = (int)uVar10;
        if (iVar11 == 0) {
          uVar13 = (this->super_Pooling).stride_w ^ 2;
          uVar12 = (this->super_Pooling).stride_h ^ 2;
          if ((((uint)opt_00 == 2 && uVar5 == 2) && uVar13 == 0) && uVar12 == 0) {
            pooling2x2s2_max_pack4_sse(&local_c8,local_108,opt_00);
          }
          else {
            uVar12 = (uint)opt_00 ^ 3 | uVar5 ^ 3 | uVar13 | uVar12;
            if (uVar12 == 0) {
              pooling3x3s2_max_pack4_sse(&local_c8,local_108,(Option *)(ulong)uVar12);
            }
            else if (0 < (int)local_100) {
              uVar4 = 0;
              do {
                if (-1 < (int)local_f8) {
                  pvVar17 = (void *)(local_108->cstep * uVar4 * local_108->elemsize +
                                    (long)local_108->data);
                  iVar3 = 0;
                  do {
                    if (-1 < (int)local_e0) {
                      uVar22 = 0;
                      do {
                        lVar9 = (long)(this->super_Pooling).stride_h * (long)iVar3 *
                                (long)local_c8.w *
                                CONCAT44(local_c8.elemsize._4_4_,(undefined4)local_c8.elemsize) +
                                local_c8.cstep * uVar4 *
                                CONCAT44(local_c8.elemsize._4_4_,(undefined4)local_c8.elemsize);
                        lVar15 = (long)((this->super_Pooling).stride_w * (int)uVar22 * 4);
                        auVar27 = *(undefined1 (*) [16])((long)local_c8.data + lVar15 * 4 + lVar9);
                        if (0 < iVar21) {
                          uVar20 = 0;
                          do {
                            auVar27 = maxps(auVar27,*(undefined1 (*) [16])
                                                     ((long)local_c8.data +
                                                     (long)local_48.
                                                  super__Vector_base<int,_std::allocator<int>_>.
                                                  _M_impl.super__Vector_impl_data._M_start[uVar20] *
                                                  0x10 + lVar15 * 4 + lVar9));
                            uVar20 = uVar20 + 1;
                          } while ((uVar10 & 0xffffffff) != uVar20);
                        }
                        *(undefined1 (*) [16])((long)pvVar17 + uVar22 * 0x10) = auVar27;
                        uVar22 = uVar22 + 1;
                      } while (uVar22 != uVar23);
                    }
                    pvVar17 = (void *)((long)pvVar17 + (long)(int)(uVar23 * 4) * 4);
                    bVar25 = iVar3 != (int)local_f8;
                    iVar3 = iVar3 + 1;
                  } while (bVar25);
                }
                uVar4 = uVar4 + 1;
              } while (uVar4 != local_100);
            }
          }
        }
        else if (iVar11 == 1) {
          if ((this->super_Pooling).avgpool_count_include_pad == 0) {
            local_110 = 0;
            local_114 = 0;
            if ((this->super_Pooling).pad_mode == 0) {
              local_110 = (bottom_blob->w - local_c8.w) + (this->super_Pooling).pad_left +
                          (this->super_Pooling).pad_right;
              local_114 = (bottom_blob->h - local_c8.h) + (this->super_Pooling).pad_top +
                          (this->super_Pooling).pad_bottom;
            }
            if (0 < (int)local_100) {
              local_114 = local_114 + (int)local_d0;
              local_60 = (long)(int)(uVar23 * 4);
              local_50 = (ulong)uVar23;
              local_f0 = 0;
              do {
                if (-1 < (int)local_f8) {
                  local_68 = local_c8.data;
                  local_70 = CONCAT44(local_c8.elemsize._4_4_,(undefined4)local_c8.elemsize);
                  local_d8 = (void *)(local_108->cstep * local_f0 * local_108->elemsize +
                                     (long)local_108->data);
                  local_78 = (long)local_c8.w;
                  local_80 = local_c8.cstep * local_f0;
                  local_e8 = 0;
                  do {
                    if (-1 < (int)local_e0) {
                      lVar9 = (long)((this->super_Pooling).stride_h * (int)local_e8);
                      local_58 = (void *)((local_78 * lVar9 + local_80) * local_70 +
                                         (long)local_c8.data);
                      uVar10 = 0;
                      do {
                        lVar15 = (long)(this->super_Pooling).kernel_h;
                        if (lVar15 < 1) {
                          fVar31 = 0.0;
                          fVar26 = 0.0;
                          fVar28 = 0.0;
                          fVar29 = 0.0;
                          fVar30 = 0.0;
                        }
                        else {
                          uVar23 = (this->super_Pooling).kernel_w;
                          local_d0 = (long)((this->super_Pooling).stride_w * (int)uVar10);
                          pvVar17 = (void *)(local_d0 * 0x10 + (long)local_58);
                          fVar26 = 0.0;
                          fVar28 = 0.0;
                          fVar29 = 0.0;
                          fVar30 = 0.0;
                          lVar19 = 0;
                          iVar11 = 0;
                          do {
                            lVar8 = lVar19 + lVar9;
                            if ((this->super_Pooling).pad_top <= lVar8) {
                              if (local_114 - (this->super_Pooling).pad_bottom <= lVar8) break;
                              if (0 < (int)uVar23) {
                                lVar24 = 0;
                                lVar8 = local_d0;
                                do {
                                  if ((this->super_Pooling).pad_left <= lVar8) {
                                    if ((local_110 + iVar3) - (this->super_Pooling).pad_right <=
                                        lVar8) break;
                                    pfVar6 = (float *)((long)pvVar17 + lVar24);
                                    fVar26 = fVar26 + *pfVar6;
                                    fVar28 = fVar28 + pfVar6[1];
                                    fVar29 = fVar29 + pfVar6[2];
                                    fVar30 = fVar30 + pfVar6[3];
                                    iVar11 = iVar11 + 1;
                                  }
                                  lVar24 = lVar24 + 0x10;
                                  lVar8 = lVar8 + 1;
                                } while ((ulong)uVar23 << 4 != lVar24);
                              }
                            }
                            lVar19 = lVar19 + 1;
                            pvVar17 = (void *)((long)pvVar17 + local_70 * local_78);
                          } while (lVar19 != lVar15);
                          fVar31 = (float)iVar11;
                        }
                        fVar31 = 1.0 / fVar31;
                        pfVar6 = (float *)((long)local_d8 + uVar10 * 0x10);
                        *pfVar6 = fVar31 * fVar26;
                        pfVar6[1] = fVar31 * fVar28;
                        pfVar6[2] = fVar31 * fVar29;
                        pfVar6[3] = fVar31 * fVar30;
                        uVar10 = uVar10 + 1;
                      } while (uVar10 != local_50);
                    }
                    local_d8 = (void *)((long)local_d8 + local_60 * 4);
                    uVar23 = (int)local_e8 + 1;
                    bVar25 = (int)local_e8 != (int)local_f8;
                    local_e8 = (ulong)uVar23;
                  } while (bVar25);
                }
                local_f0 = local_f0 + 1;
              } while (local_f0 != local_100);
            }
          }
          else if (0 < (int)local_100) {
            fVar26 = 1.0 / (float)iVar21;
            uVar4 = 0;
            do {
              if (-1 < (int)local_f8) {
                pvVar17 = (void *)(local_108->cstep * uVar4 * local_108->elemsize +
                                  (long)local_108->data);
                iVar3 = 0;
                do {
                  if (-1 < (int)local_e0) {
                    uVar22 = 0;
                    do {
                      if (iVar21 < 1) {
                        fVar28 = 0.0;
                        fVar29 = 0.0;
                        fVar30 = 0.0;
                        fVar31 = 0.0;
                      }
                      else {
                        fVar28 = 0.0;
                        fVar29 = 0.0;
                        fVar30 = 0.0;
                        fVar31 = 0.0;
                        uVar20 = 0;
                        do {
                          pfVar6 = (float *)((long)local_c8.data +
                                            (long)local_48.
                                                  super__Vector_base<int,_std::allocator<int>_>.
                                                  _M_impl.super__Vector_impl_data._M_start[uVar20] *
                                            0x10 + (long)((this->super_Pooling).stride_w *
                                                          (int)uVar22 * 4) * 4 +
                                                   (long)(this->super_Pooling).stride_h *
                                                   (long)iVar3 *
                                                   (long)local_c8.w *
                                                   CONCAT44(local_c8.elemsize._4_4_,
                                                            (undefined4)local_c8.elemsize) +
                                                   local_c8.cstep * uVar4 *
                                                   CONCAT44(local_c8.elemsize._4_4_,
                                                            (undefined4)local_c8.elemsize));
                          fVar28 = fVar28 + *pfVar6;
                          fVar29 = fVar29 + pfVar6[1];
                          fVar30 = fVar30 + pfVar6[2];
                          fVar31 = fVar31 + pfVar6[3];
                          uVar20 = uVar20 + 1;
                        } while ((uVar10 & 0xffffffff) != uVar20);
                      }
                      pfVar6 = (float *)((long)pvVar17 + uVar22 * 0x10);
                      *pfVar6 = fVar28 * fVar26;
                      pfVar6[1] = fVar29 * fVar26;
                      pfVar6[2] = fVar30 * fVar26;
                      pfVar6[3] = fVar31 * fVar26;
                      uVar22 = uVar22 + 1;
                    } while (uVar22 != uVar23);
                  }
                  pvVar17 = (void *)((long)pvVar17 + (long)(int)(uVar23 * 4) * 4);
                  bVar25 = iVar3 != (int)local_f8;
                  iVar3 = iVar3 + 1;
                } while (bVar25);
              }
              uVar4 = uVar4 + 1;
            } while (uVar4 != local_100);
          }
        }
        if (local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start != (pointer)0x0) {
          operator_delete(local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_end_of_storage -
                          (long)local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_start);
        }
        iVar11 = 0;
      }
    }
    piVar1 = (int *)CONCAT44(local_c8.refcount._4_4_,local_c8.refcount._0_4_);
    if (piVar1 != (int *)0x0) {
      LOCK();
      *piVar1 = *piVar1 + -1;
      UNLOCK();
      if (*piVar1 == 0) {
        if (local_c8.allocator == (Allocator *)0x0) {
          if (local_c8.data != (void *)0x0) {
            free(local_c8.data);
          }
        }
        else {
          (*(local_c8.allocator)->_vptr_Allocator[3])();
        }
      }
    }
  }
  else {
    iVar3 = bottom_blob->w;
    iVar21 = bottom_blob->h;
    Mat::create(top_blob,uVar23,_elemsize,4,opt->blob_allocator);
    iVar11 = -100;
    if ((top_blob->data != (void *)0x0) && ((long)top_blob->c * top_blob->cstep != 0)) {
      iVar21 = iVar21 * iVar3;
      iVar3 = (this->super_Pooling).pooling_type;
      if (iVar3 == 0) {
        if ((int)uVar23 < 1) {
          return 0;
        }
        uVar4 = 0;
        do {
          lVar9 = bottom_blob->cstep * uVar4 * bottom_blob->elemsize;
          auVar27 = *(undefined1 (*) [16])((long)bottom_blob->data + lVar9);
          if (0 < iVar21) {
            pauVar7 = (undefined1 (*) [16])((long)bottom_blob->data + lVar9);
            iVar3 = iVar21;
            do {
              auVar27 = maxps(auVar27,*pauVar7);
              pauVar7 = pauVar7 + 1;
              iVar3 = iVar3 + -1;
            } while (iVar3 != 0);
          }
          *(undefined1 (*) [16])((long)top_blob->data + uVar4 * 0x10) = auVar27;
          uVar4 = uVar4 + 1;
        } while (uVar4 != uVar10);
      }
      else {
        if (iVar3 != 1) {
          return 0;
        }
        if ((int)uVar23 < 1) {
          return 0;
        }
        fVar26 = 1.0 / (float)iVar21;
        uVar4 = 0;
        do {
          if (iVar21 < 1) {
            fVar28 = 0.0;
            fVar29 = 0.0;
            fVar30 = 0.0;
            fVar31 = 0.0;
          }
          else {
            pfVar6 = (float *)(bottom_blob->cstep * uVar4 * bottom_blob->elemsize +
                              (long)bottom_blob->data);
            fVar28 = 0.0;
            fVar29 = 0.0;
            fVar30 = 0.0;
            fVar31 = 0.0;
            iVar3 = iVar21;
            do {
              fVar28 = fVar28 + *pfVar6;
              fVar29 = fVar29 + pfVar6[1];
              fVar30 = fVar30 + pfVar6[2];
              fVar31 = fVar31 + pfVar6[3];
              pfVar6 = pfVar6 + 4;
              iVar3 = iVar3 + -1;
            } while (iVar3 != 0);
          }
          pfVar6 = (float *)((long)top_blob->data + uVar4 * 0x10);
          *pfVar6 = fVar28 * fVar26;
          pfVar6[1] = fVar29 * fVar26;
          pfVar6[2] = fVar30 * fVar26;
          pfVar6[3] = fVar31 * fVar26;
          uVar4 = uVar4 + 1;
        } while (uVar4 != uVar10);
      }
      iVar11 = 0;
    }
  }
  return iVar11;
}

Assistant:

int Pooling_x86::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    // max value in NxN window
    // avg value in NxN window

    if (adaptive_pooling)
    {
        return Pooling::forward(bottom_blob, top_blob, opt);
    }

#if __SSE2__
    int elempack = bottom_blob.elempack;
    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int channels = bottom_blob.c;
    size_t elemsize = bottom_blob.elemsize;
#if __AVX__

#if __AVX512F__
    if (elempack == 16)
    {
        if (global_pooling)
        {
            top_blob.create(channels, elemsize, elempack, opt.blob_allocator);
            if (top_blob.empty())
                return -100;

            int size = w * h;

            if (pooling_type == PoolMethod_MAX)
            {
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < channels; q++)
                {
                    const float* ptr = bottom_blob.channel(q);

                    __m512 _max = _mm512_loadu_ps(ptr);
                    for (int i = 0; i < size; i++)
                    {
                        __m512 _val = _mm512_loadu_ps(ptr);
                        _max = _mm512_max_ps(_max, _val);
                        ptr += 16;
                    }

                    float* outptr = top_blob;
                    _mm512_storeu_ps(outptr + q * 16, _max);
                }
            }
            else if (pooling_type == PoolMethod_AVE)
            {
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < channels; q++)
                {
                    const float* ptr = bottom_blob.channel(q);

                    __m512 _sum = _mm512_set1_ps(0.f);
                    for (int i = 0; i < size; i++)
                    {
                        __m512 _val = _mm512_loadu_ps(ptr);
                        _sum = _mm512_add_ps(_sum, _val);
                        ptr += 16;
                    }

                    __m512 _inv_size = _mm512_set1_ps(1.f / size);
                    __m512 _avg = _mm512_mul_ps(_sum, _inv_size);

                    float* outptr = top_blob;
                    _mm512_storeu_ps(outptr + q * 16, _avg);
                }
            }

            return 0;
        }

        Mat bottom_blob_bordered;
        make_padding(bottom_blob, bottom_blob_bordered, opt);
        if (bottom_blob_bordered.empty())
            return -100;

        w = bottom_blob_bordered.w;
        h = bottom_blob_bordered.h;

        int outw = (w - kernel_w) / stride_w + 1;
        int outh = (h - kernel_h) / stride_h + 1;

        top_blob.create(outw, outh, channels, elemsize, elempack, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        const int maxk = kernel_w * kernel_h;

        // kernel offsets
        std::vector<int> _space_ofs(maxk);
        int* space_ofs = &_space_ofs[0];
        {
            int p1 = 0;
            int p2 = 0;
            int gap = w - kernel_w;
            for (int i = 0; i < kernel_h; i++)
            {
                for (int j = 0; j < kernel_w; j++)
                {
                    space_ofs[p1] = p2;
                    p1++;
                    p2++;
                }
                p2 += gap;
            }
        }
        if (pooling_type == PoolMethod_MAX)
        {
            if (kernel_w == 2 && kernel_h == 2 && stride_w == 2 && stride_h == 2)
            {
                pooling2x2s2_max_pack16_avx512(bottom_blob_bordered, top_blob, opt);

                return 0;
            }
            if (kernel_w == 3 && kernel_h == 3 && stride_w == 2 && stride_h == 2)
            {
                pooling3x3s2_max_pack16_avx512(bottom_blob_bordered, top_blob, opt);

                return 0;
            }

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                const Mat m = bottom_blob_bordered.channel(q);
                float* outptr = top_blob.channel(q);

                for (int i = 0; i < outh; i++)
                {
                    for (int j = 0; j < outw; j++)
                    {
                        const float* sptr = m.row(i * stride_h) + j * stride_w * 16;

                        __m512 _max = _mm512_loadu_ps(sptr);

                        for (int k = 0; k < maxk; k++)
                        {
                            __m512 _val = _mm512_loadu_ps(sptr + space_ofs[k] * 16);
                            _max = _mm512_max_ps(_max, _val);
                        }

                        _mm512_storeu_ps(outptr, _max);
                        outptr += 16;
                    }
                }
            }
        }
        else if (pooling_type == PoolMethod_AVE)
        {
            if (avgpool_count_include_pad == 0)
            {
                int wtailpad = 0;
                int htailpad = 0;

                if (pad_mode == 0) // full padding
                {
                    wtailpad = bottom_blob_bordered.w - bottom_blob.w - pad_left - pad_right;
                    htailpad = bottom_blob_bordered.h - bottom_blob.h - pad_top - pad_bottom;
                }

                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < channels; q++)
                {
                    const Mat m = bottom_blob_bordered.channel(q);
                    float* outptr = top_blob.channel(q);

                    for (int i = 0; i < outh; i++)
                    {
                        int sy0 = i * stride_h;

                        for (int j = 0; j < outw; j++)
                        {
                            int sx0 = j * stride_w;

                            __m512 _sum = _mm512_set1_ps(0.f);
                            int area = 0;

                            for (int ki = 0; ki < kernel_h; ki++)
                            {
                                int sy = sy0 + ki;

                                if (sy < pad_top)
                                    continue;

                                if (sy >= h - pad_bottom - htailpad)
                                    break;

                                for (int kj = 0; kj < kernel_w; kj++)
                                {
                                    int sx = sx0 + kj;

                                    if (sx < pad_left)
                                        continue;

                                    if (sx >= w - pad_right - wtailpad)
                                        break;

                                    __m512 _val = _mm512_loadu_ps(m.row(sy) + sx * 16);
                                    _sum = _mm512_add_ps(_sum, _val);
                                    area += 1;
                                }
                            }

                            __m512 _inv_area = _mm512_set1_ps(1.f / area);
                            __m512 _avg = _mm512_mul_ps(_sum, _inv_area);
                            _mm512_storeu_ps(outptr, _avg);
                            outptr += 16;
                        }
                    }
                }
            }
            else // if (avgpool_count_include_pad == 1)
            {
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < channels; q++)
                {
                    const Mat m = bottom_blob_bordered.channel(q);
                    float* outptr = top_blob.channel(q);

                    __m512 _inv_maxk = _mm512_set1_ps(1.f / maxk);

                    for (int i = 0; i < outh; i++)
                    {
                        for (int j = 0; j < outw; j++)
                        {
                            const float* sptr = m.row(i * stride_h) + j * stride_w * 16;

                            __m512 _sum = _mm512_set1_ps(0.f);

                            for (int k = 0; k < maxk; k++)
                            {
                                __m512 _val = _mm512_loadu_ps(sptr + space_ofs[k] * 16);
                                _sum = _mm512_add_ps(_sum, _val);
                            }

                            __m512 _avg = _mm512_mul_ps(_sum, _inv_maxk);
                            _mm512_storeu_ps(outptr, _avg);
                            outptr += 16;
                        }
                    }
                }
            }
        }

        return 0;
    }
#endif // __AVX512F__

    //     NCNN_LOGE("Pooling     input %d x %d  pad = %d %d %d %d  ksize=%d %d  stride=%d %d", w, h, pad_left, pad_right, pad_top, pad_bottom, kernel_w, kernel_h, stride_w, stride_h);
    if (elempack == 8)
    {
        if (global_pooling)
        {
            top_blob.create(channels, elemsize, elempack, opt.blob_allocator);
            if (top_blob.empty())
                return -100;

            int size = w * h;

            if (pooling_type == PoolMethod_MAX)
            {
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < channels; q++)
                {
                    const float* ptr = bottom_blob.channel(q);

                    __m256 _max = _mm256_loadu_ps(ptr);
                    for (int i = 0; i < size; i++)
                    {
                        __m256 _val = _mm256_loadu_ps(ptr);
                        _max = _mm256_max_ps(_max, _val);
                        ptr += 8;
                    }

                    float* outptr = top_blob;
                    _mm256_storeu_ps(outptr + q * 8, _max);
                }
            }
            else if (pooling_type == PoolMethod_AVE)
            {
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < channels; q++)
                {
                    const float* ptr = bottom_blob.channel(q);

                    __m256 _sum = _mm256_set1_ps(0.f);
                    for (int i = 0; i < size; i++)
                    {
                        __m256 _val = _mm256_loadu_ps(ptr);
                        _sum = _mm256_add_ps(_sum, _val);
                        ptr += 8;
                    }

                    __m256 _inv_size = _mm256_set1_ps(1.f / size);
                    __m256 _avg = _mm256_mul_ps(_sum, _inv_size);

                    float* outptr = top_blob;
                    _mm256_storeu_ps(outptr + q * 8, _avg);
                }
            }

            return 0;
        }

        Mat bottom_blob_bordered;
        make_padding(bottom_blob, bottom_blob_bordered, opt);
        if (bottom_blob_bordered.empty())
            return -100;

        w = bottom_blob_bordered.w;
        h = bottom_blob_bordered.h;

        int outw = (w - kernel_w) / stride_w + 1;
        int outh = (h - kernel_h) / stride_h + 1;

        top_blob.create(outw, outh, channels, elemsize, elempack, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        const int maxk = kernel_w * kernel_h;

        // kernel offsets
        std::vector<int> _space_ofs(maxk);
        int* space_ofs = &_space_ofs[0];
        {
            int p1 = 0;
            int p2 = 0;
            int gap = w - kernel_w;
            for (int i = 0; i < kernel_h; i++)
            {
                for (int j = 0; j < kernel_w; j++)
                {
                    space_ofs[p1] = p2;
                    p1++;
                    p2++;
                }
                p2 += gap;
            }
        }
        if (pooling_type == PoolMethod_MAX)
        {
            if (kernel_w == 2 && kernel_h == 2 && stride_w == 2 && stride_h == 2)
            {
                pooling2x2s2_max_pack8_avx(bottom_blob_bordered, top_blob, opt);

                return 0;
            }
            if (kernel_w == 3 && kernel_h == 3 && stride_w == 2 && stride_h == 2)
            {
                pooling3x3s2_max_pack8_avx(bottom_blob_bordered, top_blob, opt);

                return 0;
            }

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                const Mat m = bottom_blob_bordered.channel(q);
                float* outptr = top_blob.channel(q);

                for (int i = 0; i < outh; i++)
                {
                    for (int j = 0; j < outw; j++)
                    {
                        const float* sptr = m.row(i * stride_h) + j * stride_w * 8;

                        __m256 _max = _mm256_loadu_ps(sptr);

                        for (int k = 0; k < maxk; k++)
                        {
                            __m256 _val = _mm256_loadu_ps(sptr + space_ofs[k] * 8);
                            _max = _mm256_max_ps(_max, _val);
                        }

                        _mm256_storeu_ps(outptr + j * 8, _max);
                    }

                    outptr += outw * 8;
                }
            }
        }
        else if (pooling_type == PoolMethod_AVE)
        {
            if (avgpool_count_include_pad == 0)
            {
                int wtailpad = 0;
                int htailpad = 0;

                if (pad_mode == 0) // full padding
                {
                    wtailpad = bottom_blob_bordered.w - bottom_blob.w - pad_left - pad_right;
                    htailpad = bottom_blob_bordered.h - bottom_blob.h - pad_top - pad_bottom;
                }

                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < channels; q++)
                {
                    const Mat m = bottom_blob_bordered.channel(q);
                    float* outptr = top_blob.channel(q);

                    for (int i = 0; i < outh; i++)
                    {
                        int sy0 = i * stride_h;

                        for (int j = 0; j < outw; j++)
                        {
                            int sx0 = j * stride_w;

                            __m256 _sum = _mm256_set1_ps(0.f);
                            int area = 0;

                            for (int ki = 0; ki < kernel_h; ki++)
                            {
                                int sy = sy0 + ki;

                                if (sy < pad_top)
                                    continue;

                                if (sy >= h - pad_bottom - htailpad)
                                    break;

                                for (int kj = 0; kj < kernel_w; kj++)
                                {
                                    int sx = sx0 + kj;

                                    if (sx < pad_left)
                                        continue;

                                    if (sx >= w - pad_right - wtailpad)
                                        break;

                                    __m256 _val = _mm256_loadu_ps(m.row(sy) + sx * 8);
                                    _sum = _mm256_add_ps(_sum, _val);
                                    area += 1;
                                }
                            }

                            __m256 _inv_area = _mm256_set1_ps(1.f / area);
                            __m256 _avg = _mm256_mul_ps(_sum, _inv_area);
                            _mm256_storeu_ps(outptr + j * 8, _avg);
                        }

                        outptr += outw * 8;
                    }
                }
            }
            else // if (avgpool_count_include_pad == 1)
            {
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < channels; q++)
                {
                    const Mat m = bottom_blob_bordered.channel(q);
                    float* outptr = top_blob.channel(q);

                    __m256 _inv_maxk = _mm256_set1_ps(1.f / maxk);

                    for (int i = 0; i < outh; i++)
                    {
                        for (int j = 0; j < outw; j++)
                        {
                            const float* sptr = m.row(i * stride_h) + j * stride_w * 8;

                            __m256 _sum = _mm256_set1_ps(0.f);

                            for (int k = 0; k < maxk; k++)
                            {
                                __m256 _val = _mm256_loadu_ps(sptr + space_ofs[k] * 8);
                                _sum = _mm256_add_ps(_sum, _val);
                            }

                            __m256 _avg = _mm256_mul_ps(_sum, _inv_maxk);
                            _mm256_storeu_ps(outptr + j * 8, _avg);
                        }

                        outptr += outw * 8;
                    }
                }
            }
        }

        return 0;
    }
#endif // __AVX__

    if (elempack == 4)
    {
        if (global_pooling)
        {
            top_blob.create(channels, elemsize, elempack, opt.blob_allocator);
            if (top_blob.empty())
                return -100;

            int size = w * h;

            if (pooling_type == PoolMethod_MAX)
            {
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < channels; q++)
                {
                    const float* ptr = bottom_blob.channel(q);

                    __m128 _max = _mm_loadu_ps(ptr);
                    for (int i = 0; i < size; i++)
                    {
                        __m128 _val = _mm_loadu_ps(ptr);
                        _max = _mm_max_ps(_max, _val);
                        ptr += 4;
                    }

                    float* outptr = top_blob;
                    _mm_storeu_ps(outptr + q * 4, _max);
                }
            }
            else if (pooling_type == PoolMethod_AVE)
            {
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < channels; q++)
                {
                    const float* ptr = bottom_blob.channel(q);

                    __m128 _sum = _mm_set1_ps(0.f);
                    for (int i = 0; i < size; i++)
                    {
                        __m128 _val = _mm_loadu_ps(ptr);
                        _sum = _mm_add_ps(_sum, _val);
                        ptr += 4;
                    }

                    __m128 _inv_size = _mm_set1_ps(1.f / size);
                    __m128 _avg = _mm_mul_ps(_sum, _inv_size);

                    float* outptr = top_blob;
                    _mm_storeu_ps(outptr + q * 4, _avg);
                }
            }

            return 0;
        }

        Mat bottom_blob_bordered;
        make_padding(bottom_blob, bottom_blob_bordered, opt);
        if (bottom_blob_bordered.empty())
            return -100;

        w = bottom_blob_bordered.w;
        h = bottom_blob_bordered.h;

        int outw = (w - kernel_w) / stride_w + 1;
        int outh = (h - kernel_h) / stride_h + 1;

        top_blob.create(outw, outh, channels, elemsize, elempack, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        const int maxk = kernel_w * kernel_h;

        // kernel offsets
        std::vector<int> _space_ofs(maxk);
        int* space_ofs = &_space_ofs[0];
        {
            int p1 = 0;
            int p2 = 0;
            int gap = w - kernel_w;
            for (int i = 0; i < kernel_h; i++)
            {
                for (int j = 0; j < kernel_w; j++)
                {
                    space_ofs[p1] = p2;
                    p1++;
                    p2++;
                }
                p2 += gap;
            }
        }
        if (pooling_type == PoolMethod_MAX)
        {
            if (kernel_w == 2 && kernel_h == 2 && stride_w == 2 && stride_h == 2)
            {
                pooling2x2s2_max_pack4_sse(bottom_blob_bordered, top_blob, opt);

                return 0;
            }
            if (kernel_w == 3 && kernel_h == 3 && stride_w == 2 && stride_h == 2)
            {
                pooling3x3s2_max_pack4_sse(bottom_blob_bordered, top_blob, opt);

                return 0;
            }

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                const Mat m = bottom_blob_bordered.channel(q);
                float* outptr = top_blob.channel(q);

                for (int i = 0; i < outh; i++)
                {
                    for (int j = 0; j < outw; j++)
                    {
                        const float* sptr = m.row(i * stride_h) + j * stride_w * 4;

                        __m128 _max = _mm_loadu_ps(sptr);

                        for (int k = 0; k < maxk; k++)
                        {
                            __m128 _val = _mm_loadu_ps(sptr + space_ofs[k] * 4);
                            _max = _mm_max_ps(_max, _val);
                        }

                        _mm_storeu_ps(outptr + j * 4, _max);
                    }

                    outptr += outw * 4;
                }
            }
        }
        else if (pooling_type == PoolMethod_AVE)
        {
            if (avgpool_count_include_pad == 0)
            {
                int wtailpad = 0;
                int htailpad = 0;

                if (pad_mode == 0) // full padding
                {
                    wtailpad = bottom_blob_bordered.w - bottom_blob.w - pad_left - pad_right;
                    htailpad = bottom_blob_bordered.h - bottom_blob.h - pad_top - pad_bottom;
                }

                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < channels; q++)
                {
                    const Mat m = bottom_blob_bordered.channel(q);
                    float* outptr = top_blob.channel(q);

                    for (int i = 0; i < outh; i++)
                    {
                        int sy0 = i * stride_h;

                        for (int j = 0; j < outw; j++)
                        {
                            int sx0 = j * stride_w;

                            __m128 _sum = _mm_set1_ps(0.f);
                            int area = 0;

                            for (int ki = 0; ki < kernel_h; ki++)
                            {
                                int sy = sy0 + ki;

                                if (sy < pad_top)
                                    continue;

                                if (sy >= h - pad_bottom - htailpad)
                                    break;

                                for (int kj = 0; kj < kernel_w; kj++)
                                {
                                    int sx = sx0 + kj;

                                    if (sx < pad_left)
                                        continue;

                                    if (sx >= w - pad_right - wtailpad)
                                        break;

                                    __m128 _val = _mm_loadu_ps(m.row(sy) + sx * 4);
                                    _sum = _mm_add_ps(_sum, _val);
                                    area += 1;
                                }
                            }

                            __m128 _inv_area = _mm_set1_ps(1.f / area);
                            __m128 _avg = _mm_mul_ps(_sum, _inv_area);
                            _mm_storeu_ps(outptr + j * 4, _avg);
                        }

                        outptr += outw * 4;
                    }
                }
            }
            else // if (avgpool_count_include_pad == 1)
            {
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < channels; q++)
                {
                    const Mat m = bottom_blob_bordered.channel(q);
                    float* outptr = top_blob.channel(q);

                    __m128 _inv_maxk = _mm_set1_ps(1.f / maxk);

                    for (int i = 0; i < outh; i++)
                    {
                        for (int j = 0; j < outw; j++)
                        {
                            const float* sptr = m.row(i * stride_h) + j * stride_w * 4;

                            __m128 _sum = _mm_set1_ps(0.f);

                            for (int k = 0; k < maxk; k++)
                            {
                                __m128 _val = _mm_loadu_ps(sptr + space_ofs[k] * 4);
                                _sum = _mm_add_ps(_sum, _val);
                            }

                            __m128 _avg = _mm_mul_ps(_sum, _inv_maxk);
                            _mm_storeu_ps(outptr + j * 4, _avg);
                        }

                        outptr += outw * 4;
                    }
                }
            }
        }

        return 0;
    }
#endif // __SSE2__

    if (kernel_w != kernel_h || stride_w != stride_h)
    {
        return Pooling::forward(bottom_blob, top_blob, opt);
    }

    const int stride = stride_w;

    if (pooling_type != PoolMethod_MAX || stride != 2 || global_pooling == 1)
    {
        return Pooling::forward(bottom_blob, top_blob, opt);
    }

#if __AVX__
    const int kernel_size = kernel_w;

    if (kernel_size != 2)
    {
        return Pooling::forward(bottom_blob, top_blob, opt);
    }

    Mat bottom_blob_bordered;
    make_padding(bottom_blob, bottom_blob_bordered, opt);
    if (bottom_blob_bordered.empty())
        return -100;

    w = bottom_blob_bordered.w;
    h = bottom_blob_bordered.h;

    int outw = (w - kernel_w) / stride_w + 1;
    int outh = (h - kernel_h) / stride_h + 1;

    top_blob.create(outw, outh, channels, elemsize, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    if (kernel_size == 2)
        pooling2x2s2_max_avx(bottom_blob_bordered, top_blob, opt);

    return 0;
#else
    return Pooling::forward(bottom_blob, top_blob, opt);
#endif
}